

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall r_exec::Group::inject_secondary_mdl_controller(Group *this,View *view)

{
  View *pVVar1;
  Atom *this_00;
  mapped_type *this_01;
  SecondaryMDLController *this_02;
  Code *pCVar2;
  View *local_50;
  SecondaryMDLController *local_48;
  SecondaryMDLController *s;
  Atom local_38 [16];
  View *local_28;
  View *_view;
  PrimaryMDLController *p;
  View *view_local;
  Group *this_local;
  
  p = (PrimaryMDLController *)view;
  view_local = (View *)this;
  _view = (View *)core::P::operator_cast_to_PrimaryMDLController_((P *)&view->controller);
  pVVar1 = (View *)operator_new(0x100);
  View::View(pVVar1,(View *)p,true);
  local_28 = pVVar1;
  r_code::Atom::Float(0.0);
  this_00 = r_code::View::code(&local_28->super_View,7);
  r_code::Atom::operator=(this_00,local_38);
  r_code::Atom::~Atom(local_38);
  pVVar1 = local_28;
  (local_28->super_View).references[0] = (Code *)this;
  s = (SecondaryMDLController *)View::get_oid(local_28);
  this_01 = std::
            unordered_map<unsigned_long,_core::P<r_exec::View>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>_>
            ::operator[](&this->ipgm_views,(key_type *)&s);
  core::P<r_exec::View>::operator=(this_01,pVVar1);
  this_02 = (SecondaryMDLController *)operator_new(0x440);
  SecondaryMDLController::SecondaryMDLController(this_02,&local_28->super_View);
  local_48 = this_02;
  core::P<r_exec::Controller>::operator=(&local_28->controller,(Controller *)this_02);
  pCVar2 = core::P<r_code::Code>::operator->
                     ((P<r_code::Code> *)
                      &(p->super_PMDLController).super_MDLController.super_HLPController.
                       super_OController.super_Controller.tsc);
  local_50 = local_28;
  std::
  unordered_set<r_code::View_*,_r_code::View::Hash,_r_code::View::Equal,_std::allocator<r_code::View_*>_>
  ::insert(&pCVar2->views,(value_type *)&local_50);
  PrimaryMDLController::set_secondary((PrimaryMDLController *)_view,local_48);
  SecondaryMDLController::set_primary(local_48,(PrimaryMDLController *)_view);
  return;
}

Assistant:

void Group::inject_secondary_mdl_controller(View *view)
{
    PrimaryMDLController *p = (PrimaryMDLController *)view->controller;
    View *_view = new View(view, true);
    _view->code(VIEW_ACT) = Atom::Float(0);
    _view->references[0] = this;
    ipgm_views[_view->get_oid()] = _view;
    SecondaryMDLController *s = new SecondaryMDLController(_view);
    _view->controller = s;
    view->object->views.insert(_view);
    p->set_secondary(s);
    s->set_primary(p);
}